

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O0

void __thiscall gpu::Context::Data::Data(Data *this)

{
  Data *this_local;
  
  std::shared_ptr<ocl::OpenCLEngine>::shared_ptr(&this->ocl_engine);
  this->type = TypeUndefined;
  this->cuda_device = 0;
  this->cuda_context = (cudaContext_t)0x0;
  this->cuda_stream = (cudaStream_t)0x0;
  this->ocl_device = (_cl_device_id *)0x0;
  this->activated = false;
  return;
}

Assistant:

Context::Data::Data()
{
	type			= TypeUndefined;
	cuda_device		= 0;
	cuda_context	= 0;
	cuda_stream		= 0;
	ocl_device		= 0;
	activated		= false;
}